

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O3

int nextSwap(swapInfo *x)

{
  int iVar1;
  varInfo *pvVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  if (1 < x->varN) {
    pvVar2 = x->posArray;
    piVar3 = x->realArray;
    uVar6 = x->varN;
    do {
      lVar8 = (long)pvVar2[uVar6].direction + (long)pvVar2[uVar6].position;
      if (piVar3[lVar8] < (int)uVar6) {
        pvVar2[uVar6].position = (int)lVar8;
        iVar1 = piVar3[lVar8];
        piVar3[lVar8] = uVar6;
        piVar3[(long)pvVar2[uVar6].position - (long)pvVar2[uVar6].direction] = iVar1;
        iVar5 = pvVar2[uVar6].position - pvVar2[uVar6].direction;
        pvVar2[iVar1].position = iVar5;
        for (uVar7 = x->varN; (int)uVar6 < (int)uVar7; uVar7 = uVar7 - 1) {
          pvVar2[uVar7].direction = -pvVar2[uVar7].direction;
        }
        x->positionToSwap1 = iVar5 + -1;
        x->positionToSwap2 = pvVar2[uVar6].position + -1;
        return 1;
      }
      bVar4 = 2 < (int)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar4);
  }
  return 0;
}

Assistant:

int nextSwap(swapInfo* x)
{
	int i,j,temp;
	for(i=x->varN;i>1;i--)
	{
		if( i > x->realArray[x->posArray[i].position + x->posArray[i].direction] )
		{
			x->posArray[i].position = x->posArray[i].position + x->posArray[i].direction;
			temp = x->realArray[x->posArray[i].position];
			x->realArray[x->posArray[i].position] = i; 
			x->realArray[x->posArray[i].position - x->posArray[i].direction] = temp;
			x->posArray[temp].position = x->posArray[i].position - x->posArray[i].direction; 
			for(j=x->varN;j>i;j--)
			{
				x->posArray[j].direction = 	x->posArray[j].direction * -1;
			}
			x->positionToSwap1 = x->posArray[temp].position - 1;
			x->positionToSwap2 = x->posArray[i].position - 1;			
			return 1;
		}
		
	}
	return 0;	
}